

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_impl_sdl.cpp
# Opt level: O2

void ImGui_ImplSDL2_NewFrame(SDL_Window *window)

{
  bool bVar1;
  byte bVar2;
  char cVar3;
  short sVar4;
  ImGuiMouseCursor IVar5;
  int iVar6;
  ImGuiIO *pIVar7;
  Uint64 UVar8;
  SDL_Window *pSVar9;
  long lVar10;
  undefined4 uVar11;
  SDL_Cursor *pSVar12;
  float fVar13;
  float fVar14;
  ImVec2 IVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  int display_h;
  int display_w;
  int my;
  int mx;
  int h;
  int w;
  int local_38;
  int wx;
  
  pIVar7 = ImGui::GetIO();
  bVar1 = ImFontAtlas::IsBuilt(pIVar7->Fonts);
  if (bVar1) {
    SDL_GetWindowSize(window,&w,&h);
    SDL_GL_GetDrawableSize(window,&display_w,&display_h);
    IVar15.x = (float)w;
    IVar15.y = (float)h;
    auVar19._8_8_ = 0;
    auVar19._0_4_ = IVar15.x;
    auVar19._4_4_ = IVar15.y;
    pIVar7->DisplaySize = IVar15;
    if (0 < h && 0 < w) {
      auVar18._0_4_ = (float)display_w;
      auVar18._4_4_ = (float)display_h;
      auVar18._8_8_ = 0;
      auVar19 = divps(auVar18,auVar19);
      pIVar7->DisplayFramebufferScale = auVar19._0_8_;
    }
    if (ImGui_ImplSDL2_NewFrame(SDL_Window*)::frequency == '\0') {
      iVar6 = __cxa_guard_acquire(&ImGui_ImplSDL2_NewFrame(SDL_Window*)::frequency);
      if (iVar6 != 0) {
        ImGui_ImplSDL2_NewFrame::frequency = SDL_GetPerformanceFrequency();
        __cxa_guard_release(&ImGui_ImplSDL2_NewFrame(SDL_Window*)::frequency);
      }
    }
    UVar8 = SDL_GetPerformanceCounter();
    if (g_Time == 0) {
      fVar13 = 0.016666668;
    }
    else {
      lVar10 = UVar8 - g_Time;
      auVar16._8_4_ = (int)((ulong)lVar10 >> 0x20);
      auVar16._0_8_ = lVar10;
      auVar16._12_4_ = 0x45300000;
      auVar17._8_4_ = (int)(ImGui_ImplSDL2_NewFrame::frequency >> 0x20);
      auVar17._0_8_ = ImGui_ImplSDL2_NewFrame::frequency;
      auVar17._12_4_ = 0x45300000;
      fVar13 = (float)(((auVar16._8_8_ - 1.9342813113834067e+25) +
                       ((double)CONCAT44(0x43300000,(int)lVar10) - 4503599627370496.0)) /
                      ((auVar17._8_8_ - 1.9342813113834067e+25) +
                      ((double)CONCAT44(0x43300000,(int)ImGui_ImplSDL2_NewFrame::frequency) -
                      4503599627370496.0)));
    }
    pIVar7->DeltaTime = fVar13;
    g_Time = UVar8;
    pIVar7 = ImGui::GetIO();
    if (pIVar7->WantSetMousePos == true) {
      SDL_WarpMouseInWindow(g_Window,(int)(pIVar7->MousePos).x,(int)(pIVar7->MousePos).y);
    }
    else {
      (pIVar7->MousePos).x = -3.4028235e+38;
      (pIVar7->MousePos).y = -3.4028235e+38;
    }
    bVar2 = SDL_GetMouseState(&mx,&my);
    pIVar7->MouseDown[0] = (bool)((_ZL14g_MousePressed_0 | bVar2) & 1);
    pIVar7->MouseDown[1] = (bool)((bVar2 >> 2 | _ZL14g_MousePressed_1) & 1);
    pIVar7->MouseDown[2] = (bool)((bVar2 >> 1 | _ZL14g_MousePressed_2) & 1);
    _ZL14g_MousePressed_2 = 0;
    _ZL14g_MousePressed_1 = 0;
    _ZL14g_MousePressed_0 = 0;
    pSVar9 = (SDL_Window *)SDL_GetKeyboardFocus();
    if (g_Window == pSVar9) {
      SDL_GetWindowPosition(pSVar9,&wx,&local_38);
      SDL_GetGlobalMouseState(&mx,&my);
      mx = mx - wx;
      my = my - local_38;
      (pIVar7->MousePos).x = (float)mx;
      (pIVar7->MousePos).y = (float)my;
    }
    bVar1 = ImGui::IsAnyMouseDown();
    SDL_CaptureMouse(bVar1);
    pIVar7 = ImGui::GetIO();
    if ((pIVar7->ConfigFlags & 0x20) == 0) {
      IVar5 = ImGui::GetMouseCursor();
      uVar11 = 0;
      if ((IVar5 != -1) && (pIVar7->MouseDrawCursor == false)) {
        pSVar12 = g_MouseCursors[IVar5];
        if (g_MouseCursors[IVar5] == (SDL_Cursor *)0x0) {
          pSVar12 = g_MouseCursors[0];
        }
        uVar11 = 1;
        SDL_SetCursor(pSVar12);
      }
      SDL_ShowCursor(uVar11);
    }
    pIVar7 = ImGui::GetIO();
    pIVar7->NavInputs[0] = 0.0;
    pIVar7->NavInputs[1] = 0.0;
    pIVar7->NavInputs[2] = 0.0;
    pIVar7->NavInputs[3] = 0.0;
    pIVar7->NavInputs[4] = 0.0;
    pIVar7->NavInputs[5] = 0.0;
    pIVar7->NavInputs[6] = 0.0;
    pIVar7->NavInputs[7] = 0.0;
    pIVar7->NavInputs[8] = 0.0;
    pIVar7->NavInputs[9] = 0.0;
    pIVar7->NavInputs[10] = 0.0;
    pIVar7->NavInputs[0xb] = 0.0;
    pIVar7->NavInputs[0x14] = 0.0;
    pIVar7->NavInputs[0x15] = 0.0;
    pIVar7->NavInputs[0xc] = 0.0;
    pIVar7->NavInputs[0xd] = 0.0;
    pIVar7->NavInputs[0xe] = 0.0;
    pIVar7->NavInputs[0xf] = 0.0;
    pIVar7->NavInputs[0x10] = 0.0;
    pIVar7->NavInputs[0x11] = 0.0;
    pIVar7->NavInputs[0x12] = 0.0;
    pIVar7->NavInputs[0x13] = 0.0;
    if ((pIVar7->ConfigFlags & 2) != 0) {
      lVar10 = SDL_GameControllerOpen(0);
      if (lVar10 == 0) {
        *(byte *)&pIVar7->BackendFlags = (byte)pIVar7->BackendFlags & 0xfe;
      }
      else {
        cVar3 = SDL_GameControllerGetButton(lVar10,0);
        fVar13 = 0.0;
        if (cVar3 != '\0') {
          fVar13 = 1.0;
        }
        pIVar7->NavInputs[0] = fVar13;
        cVar3 = SDL_GameControllerGetButton(lVar10,1);
        fVar13 = 0.0;
        if (cVar3 != '\0') {
          fVar13 = 1.0;
        }
        pIVar7->NavInputs[1] = fVar13;
        cVar3 = SDL_GameControllerGetButton(lVar10,2);
        fVar13 = 0.0;
        if (cVar3 != '\0') {
          fVar13 = 1.0;
        }
        pIVar7->NavInputs[3] = fVar13;
        cVar3 = SDL_GameControllerGetButton(lVar10,3);
        fVar13 = 0.0;
        if (cVar3 != '\0') {
          fVar13 = 1.0;
        }
        pIVar7->NavInputs[2] = fVar13;
        cVar3 = SDL_GameControllerGetButton(lVar10,0xd);
        fVar13 = 0.0;
        if (cVar3 != '\0') {
          fVar13 = 1.0;
        }
        pIVar7->NavInputs[4] = fVar13;
        cVar3 = SDL_GameControllerGetButton(lVar10,0xe);
        fVar13 = 0.0;
        if (cVar3 != '\0') {
          fVar13 = 1.0;
        }
        pIVar7->NavInputs[5] = fVar13;
        cVar3 = SDL_GameControllerGetButton(lVar10,0xb);
        fVar13 = 0.0;
        if (cVar3 != '\0') {
          fVar13 = 1.0;
        }
        pIVar7->NavInputs[6] = fVar13;
        cVar3 = SDL_GameControllerGetButton(lVar10,0xc);
        fVar13 = 0.0;
        if (cVar3 != '\0') {
          fVar13 = 1.0;
        }
        pIVar7->NavInputs[7] = fVar13;
        cVar3 = SDL_GameControllerGetButton(lVar10,9);
        fVar13 = 0.0;
        if (cVar3 != '\0') {
          fVar13 = 1.0;
        }
        pIVar7->NavInputs[0xc] = fVar13;
        cVar3 = SDL_GameControllerGetButton(lVar10,10);
        fVar13 = 0.0;
        if (cVar3 != '\0') {
          fVar13 = 1.0;
        }
        pIVar7->NavInputs[0xd] = fVar13;
        cVar3 = SDL_GameControllerGetButton(lVar10,9);
        fVar13 = 0.0;
        if (cVar3 != '\0') {
          fVar13 = 1.0;
        }
        pIVar7->NavInputs[0xe] = fVar13;
        cVar3 = SDL_GameControllerGetButton(lVar10,10);
        fVar13 = 0.0;
        if (cVar3 != '\0') {
          fVar13 = 1.0;
        }
        pIVar7->NavInputs[0xf] = fVar13;
        sVar4 = SDL_GameControllerGetAxis(lVar10,0);
        fVar14 = (float)(sVar4 + 8000) / -24768.0;
        fVar13 = 1.0;
        if (fVar14 <= 1.0) {
          fVar13 = fVar14;
        }
        if ((0.0 < fVar13) && (pIVar7->NavInputs[8] <= fVar13 && fVar13 != pIVar7->NavInputs[8])) {
          pIVar7->NavInputs[8] = fVar13;
        }
        sVar4 = SDL_GameControllerGetAxis(lVar10,0);
        fVar14 = (float)(sVar4 + -8000) / 24767.0;
        fVar13 = 1.0;
        if (fVar14 <= 1.0) {
          fVar13 = fVar14;
        }
        if ((0.0 < fVar13) && (pIVar7->NavInputs[9] <= fVar13 && fVar13 != pIVar7->NavInputs[9])) {
          pIVar7->NavInputs[9] = fVar13;
        }
        sVar4 = SDL_GameControllerGetAxis(lVar10,1);
        fVar14 = (float)(sVar4 + 8000) / -24767.0;
        fVar13 = 1.0;
        if (fVar14 <= 1.0) {
          fVar13 = fVar14;
        }
        if ((0.0 < fVar13) && (pIVar7->NavInputs[10] <= fVar13 && fVar13 != pIVar7->NavInputs[10]))
        {
          pIVar7->NavInputs[10] = fVar13;
        }
        sVar4 = SDL_GameControllerGetAxis(lVar10,1);
        fVar14 = (float)(sVar4 + -8000) / 24767.0;
        fVar13 = 1.0;
        if (fVar14 <= 1.0) {
          fVar13 = fVar14;
        }
        if ((0.0 < fVar13) && (pIVar7->NavInputs[0xb] <= fVar13 && fVar13 != pIVar7->NavInputs[0xb])
           ) {
          pIVar7->NavInputs[0xb] = fVar13;
        }
        *(byte *)&pIVar7->BackendFlags = (byte)pIVar7->BackendFlags | 1;
      }
    }
    return;
  }
  __assert_fail("io.Fonts->IsBuilt() && \"Font atlas not built! It is generally built by the renderer back-end. Missing call to renderer _NewFrame() function? e.g. ImGui_ImplOpenGL3_NewFrame().\""
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/Green-Sky[P]imgui_entt_entity_editor_demo/external/imgui/impl/imgui_impl_sdl.cpp"
                ,0x143,"void ImGui_ImplSDL2_NewFrame(SDL_Window *)");
}

Assistant:

void ImGui_ImplSDL2_NewFrame(SDL_Window* window)
{
    ImGuiIO& io = ImGui::GetIO();
    IM_ASSERT(io.Fonts->IsBuilt() && "Font atlas not built! It is generally built by the renderer back-end. Missing call to renderer _NewFrame() function? e.g. ImGui_ImplOpenGL3_NewFrame().");

    // Setup display size (every frame to accommodate for window resizing)
    int w, h;
    int display_w, display_h;
    SDL_GetWindowSize(window, &w, &h);
    SDL_GL_GetDrawableSize(window, &display_w, &display_h);
    io.DisplaySize = ImVec2((float)w, (float)h);
    if (w > 0 && h > 0)
        io.DisplayFramebufferScale = ImVec2((float)display_w / w, (float)display_h / h);

    // Setup time step (we don't use SDL_GetTicks() because it is using millisecond resolution)
    static Uint64 frequency = SDL_GetPerformanceFrequency();
    Uint64 current_time = SDL_GetPerformanceCounter();
    io.DeltaTime = g_Time > 0 ? (float)((double)(current_time - g_Time) / frequency) : (float)(1.0f / 60.0f);
    g_Time = current_time;

    ImGui_ImplSDL2_UpdateMousePosAndButtons();
    ImGui_ImplSDL2_UpdateMouseCursor();

    // Update game controllers (if enabled and available)
    ImGui_ImplSDL2_UpdateGamepads();
}